

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

void DoKill(AActor *killtarget,AActor *inflictor,AActor *source,FName *damagetype,int flags,
           PClassActor *filter,FName *species)

{
  int damage;
  int flags_00;
  FName *source_00;
  AActor *pAVar1;
  AActor *target;
  uint uVar2;
  bool bVar3;
  bool local_79;
  TAngle<double> local_60;
  FName local_58;
  TFlags<ActorFlag5,_unsigned_int> local_54;
  TFlags<ActorFlag7,_unsigned_int> local_50;
  TFlags<ActorFlag2,_unsigned_int> local_4c;
  TFlags<ActorFlag,_unsigned_int> local_48;
  int local_44;
  FName local_40;
  int dmgFlags;
  bool speciespass;
  PClassActor *pPStack_38;
  bool filterpass;
  PClassActor *filter_local;
  FName *pFStack_28;
  int flags_local;
  FName *damagetype_local;
  AActor *source_local;
  AActor *inflictor_local;
  AActor *killtarget_local;
  
  pPStack_38 = filter;
  filter_local._4_4_ = flags;
  pFStack_28 = damagetype;
  damagetype_local = (FName *)source;
  source_local = inflictor;
  inflictor_local = killtarget;
  dmgFlags._3_1_ = DoCheckClass(killtarget,filter,(flags & 0x10U) != 0);
  pAVar1 = inflictor_local;
  FName::FName(&local_40,species);
  dmgFlags._2_1_ = DoCheckSpecies(pAVar1,&local_40,(filter_local._4_4_ & 0x20) != 0);
  if ((filter_local._4_4_ & 0x40) == 0) {
    if ((dmgFlags._3_1_ & 1) == 0) {
      return;
    }
  }
  else if ((dmgFlags._3_1_ & 1) != 0) goto LAB_00531bc4;
  if (!(bool)dmgFlags._2_1_) {
    return;
  }
LAB_00531bc4:
  local_44 = 0xd1;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_48,
             (int)inflictor_local +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
  local_79 = uVar2 != 0 && (filter_local._4_4_ & 2) != 0;
  if (local_79) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_4c,(int)inflictor_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
    if ((uVar2 == 0) || (bVar3 = false, (filter_local._4_4_ & 1) != 0)) {
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_50,
                 (int)inflictor_local +
                 (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
      if ((uVar2 == 0) || (bVar3 = false, (filter_local._4_4_ & 8) != 0)) {
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_54,
                   (int)inflictor_local +
                   (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
        bVar3 = uVar2 == 0;
      }
    }
    if (bVar3) {
      P_ExplodeMissile(inflictor_local,(line_t_conflict *)0x0,(AActor *)0x0);
    }
  }
  target = inflictor_local;
  pAVar1 = source_local;
  source_00 = damagetype_local;
  if ((filter_local._4_4_ & 4) == 0) {
    damage = inflictor_local->health;
    FName::FName(&local_58,damagetype);
    flags_00 = local_44;
    TAngle<double>::TAngle(&local_60,0.0);
    P_DamageMobj(target,pAVar1,(AActor *)source_00,damage,&local_58,flags_00,&local_60);
  }
  return;
}

Assistant:

static void DoKill(AActor *killtarget, AActor *inflictor, AActor *source, FName damagetype, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(killtarget, filter, !!(flags & KILS_EXFILTER)),
		speciespass = DoCheckSpecies(killtarget, species, !!(flags & KILS_EXSPECIES));
	if ((flags & KILS_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass)) //Check this first. I think it'll save the engine a lot more time this way.
	{
		int dmgFlags = DMG_NO_ARMOR | DMG_NO_FACTOR;

		if (KILS_FOILINVUL)
			dmgFlags |= DMG_FOILINVUL;
		if (KILS_FOILBUDDHA)
			dmgFlags |= DMG_FOILBUDDHA;
	
		if ((killtarget->flags & MF_MISSILE) && (flags & KILS_KILLMISSILES))
		{
			//[MC] Now that missiles can set masters, lets put in a check to properly destroy projectiles. BUT FIRST! New feature~!
			//Check to see if it's invulnerable. Disregarded if foilinvul is on, but never works on a missile with NODAMAGE
			//since that's the whole point of it.
			if ((!(killtarget->flags2 & MF2_INVULNERABLE) || (flags & KILS_FOILINVUL)) &&
				(!(killtarget->flags7 & MF7_BUDDHA) || (flags & KILS_FOILBUDDHA)) && 
				!(killtarget->flags5 & MF5_NODAMAGE))
			{
				P_ExplodeMissile(killtarget, NULL, NULL);
			}
		}
		if (!(flags & KILS_NOMONSTERS))
		{
			P_DamageMobj(killtarget, inflictor, source, killtarget->health, damagetype, dmgFlags);
		}
	}
}